

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O2

void __thiscall amrex::IFABio::write_header(IFABio *this,ostream *os,IArrayBox *fab,int nvar)

{
  ostream *poVar1;
  IntDescriptor *id;
  
  poVar1 = std::operator<<(os,"IFAB ");
  id = FPC::NativeIntDescriptor();
  amrex::operator<<(poVar1,id);
  poVar1 = amrex::operator<<(os,&(fab->super_BaseFab<int>).domain);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nvar);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void
IFABio::write_header (std::ostream& os, const IArrayBox& fab, int nvar) const
{
    AMREX_ASSERT(nvar <= fab.nComp());
    os <<"IFAB " << FPC::NativeIntDescriptor();
    os << fab.box() << ' ' << nvar << '\n';
}